

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O2

string * __thiscall
wabt::(anonymous_namespace)::TypesToString_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,TypeVector *types,char *prefix
          )

{
  int iVar1;
  char *pcVar2;
  size_t i;
  ulong uVar3;
  allocator local_31;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,"[",&local_31);
  if (types != (TypeVector *)0x0) {
    std::__cxx11::string::append((string *)__return_storage_ptr__,(char *)types);
  }
  uVar3 = 0;
  do {
    if ((ulong)(*(long *)(this + 8) - *(long *)this >> 2) <= uVar3) {
      std::__cxx11::string::append((string *)__return_storage_ptr__,"]");
      return __return_storage_ptr__;
    }
    iVar1 = *(int *)(*(long *)this + uVar3 * 4);
    pcVar2 = "i32";
    switch(iVar1) {
    case 0:
      pcVar2 = "any";
      break;
    case -0x10:
      pcVar2 = "anyfunc";
      break;
    case -0xf:
    case -0xe:
    case -0xd:
    case -0xc:
    case -0xb:
    case -10:
    case -9:
    case -8:
    case -7:
    case -6:
switchD_00d9f2eb_caseD_fffffff1:
      pcVar2 = "<type index>";
      break;
    case -5:
      pcVar2 = "v128";
      break;
    case -4:
      pcVar2 = "f64";
      break;
    case -3:
      pcVar2 = "f32";
      break;
    case -2:
      pcVar2 = "i64";
      break;
    case -1:
      break;
    default:
      if (iVar1 == -0x40) {
        pcVar2 = "void";
      }
      else if (iVar1 == -0x20) {
        pcVar2 = "func";
      }
      else {
        if (iVar1 != -0x18) goto switchD_00d9f2eb_caseD_fffffff1;
        pcVar2 = "except_ref";
      }
    }
    std::__cxx11::string::append((string *)__return_storage_ptr__,pcVar2);
    if (uVar3 < (*(long *)(this + 8) - *(long *)this >> 2) - 1U) {
      std::__cxx11::string::append((string *)__return_storage_ptr__,", ");
    }
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

std::string TypesToString(const TypeVector& types,
                          const char* prefix = nullptr) {
  std::string result = "[";
  if (prefix) {
    result += prefix;
  }

  for (size_t i = 0; i < types.size(); ++i) {
    result += GetTypeName(types[i]);
    if (i < types.size() - 1) {
      result += ", ";
    }
  }
  result += "]";
  return result;
}